

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse2_128_8.c
# Opt level: O1

parasail_result_t *
parasail_sw_diag_sse2_128_8
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char cVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  parasail_result_t *ppVar14;
  int8_t *ptr;
  int8_t *ptr_00;
  int8_t *ptr_01;
  int8_t *ptr_02;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  char cVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  uint uVar39;
  undefined4 uVar40;
  undefined1 uVar54;
  undefined1 uVar55;
  __m128i_8_t A_1;
  undefined1 auVar41 [16];
  undefined1 uVar56;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  char cVar80;
  char cVar81;
  char cVar82;
  char cVar83;
  char cVar84;
  char cVar85;
  char cVar86;
  char cVar87;
  char cVar88;
  char cVar89;
  char cVar90;
  char cVar91;
  char cVar92;
  char cVar93;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  char cVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  __m128i_8_t A;
  undefined1 local_268 [16];
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  char local_1c8;
  char cStack_1c7;
  char cStack_1c6;
  char cStack_1c5;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  char local_118;
  char cStack_117;
  char cStack_116;
  char cStack_115;
  char cStack_114;
  char cStack_113;
  char cStack_112;
  char cStack_111;
  char cStack_110;
  char cStack_10f;
  char cStack_10e;
  char cStack_10d;
  char cStack_10c;
  char cStack_10b;
  char cStack_10a;
  char cStack_109;
  undefined1 local_108 [16];
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  ulong local_c0;
  int *local_b8;
  int *local_b0;
  int *local_a8;
  int *local_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  short sVar97;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_diag_sse2_128_8_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_diag_sse2_128_8_cold_6();
  }
  else if (open < 0) {
    parasail_sw_diag_sse2_128_8_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_diag_sse2_128_8_cold_4();
  }
  else {
    uVar37 = (ulong)(uint)_s1Len;
    if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sw_diag_sse2_128_8_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sw_diag_sse2_128_8_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_sw_diag_sse2_128_8_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        uVar37 = (ulong)(uint)matrix->length;
      }
      iVar13 = matrix->min;
      uVar27 = (uint)(byte)-(char)iVar13;
      if (iVar13 != -open && SBORROW4(iVar13,-open) == iVar13 + open < 0) {
        uVar27 = open;
      }
      cVar10 = (char)uVar27 + -0x7f;
      cVar34 = '~' - (char)matrix->max;
      auVar41 = pshuflw(ZEXT216(CONCAT11(cVar10,cVar10)),ZEXT216(CONCAT11(cVar10,cVar10)),0);
      uVar40 = auVar41._0_4_;
      local_128._4_4_ = uVar40;
      local_128._0_4_ = uVar40;
      local_128._8_4_ = uVar40;
      local_128._12_4_ = uVar40;
      local_198._4_4_ = uVar40;
      local_198._0_4_ = uVar40;
      local_198._8_4_ = uVar40;
      local_198._12_4_ = uVar40;
      local_1a8._4_4_ = uVar40;
      local_1a8._0_4_ = uVar40;
      local_1a8._8_4_ = uVar40;
      local_1a8._12_4_ = uVar40;
      local_138._4_4_ = uVar40;
      local_138._0_4_ = uVar40;
      local_138._8_4_ = uVar40;
      local_138._12_4_ = uVar40;
      local_1c8 = auVar41[0];
      cStack_1c7 = auVar41[1];
      cStack_1c6 = auVar41[2];
      cStack_1c5 = auVar41[3];
      local_148._4_4_ = uVar40;
      local_148._0_4_ = uVar40;
      local_148._8_4_ = uVar40;
      local_148._12_4_ = uVar40;
      ppVar14 = parasail_result_new();
      if (ppVar14 != (parasail_result_t *)0x0) {
        ppVar14->flag = ppVar14->flag | 0x10101004;
        uVar36 = (ulong)(s2Len + 0x1e);
        ptr = parasail_memalign_int8_t(0x10,uVar36);
        ptr_00 = parasail_memalign_int8_t(0x10,uVar36);
        ptr_01 = parasail_memalign_int8_t(0x10,uVar36);
        if (ptr_01 != (int8_t *)0x0 && (ptr_00 != (int8_t *)0x0 && ptr != (int8_t *)0x0)) {
          uVar27 = (uint)uVar37;
          if (matrix->type == 0) {
            iVar13 = uVar27 + 0xf;
            ptr_02 = parasail_memalign_int8_t(0x10,(long)iVar13);
            if (ptr_02 == (int8_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < (int)uVar27) {
              uVar36 = 0;
              do {
                ptr_02[uVar36] = (int8_t)matrix->mapper[(byte)_s1[uVar36]];
                uVar36 = uVar36 + 1;
              } while (uVar37 != uVar36);
            }
            iVar19 = uVar27 + 1;
            if ((int)(uVar27 + 1) < iVar13) {
              iVar19 = iVar13;
            }
            memset(ptr_02 + (int)uVar27,0,(ulong)(~uVar27 + iVar19) + 1);
          }
          else {
            ptr_02 = (int8_t *)0x0;
          }
          uVar17 = s2Len + 0xf;
          auVar41 = ZEXT216(CONCAT11(cVar34,cVar34));
          auVar41 = pshuflw(auVar41,auVar41,0);
          local_118 = auVar41[0];
          cStack_117 = auVar41[1];
          cStack_116 = auVar41[2];
          cStack_115 = auVar41[3];
          auVar41[4] = local_1c8;
          auVar41._0_4_ = uVar40;
          auVar41[5] = cStack_1c7;
          auVar41[6] = cStack_1c6;
          auVar41[7] = cStack_1c5;
          auVar41[8] = local_1c8;
          auVar41[9] = cStack_1c7;
          auVar41[10] = cStack_1c6;
          auVar41[0xb] = cStack_1c5;
          auVar41[0xc] = local_1c8;
          auVar41[0xd] = cStack_1c7;
          auVar41[0xe] = cStack_1c6;
          auVar41[0xf] = cStack_1c5;
          local_88 = auVar41 >> 8;
          uVar56 = (undefined1)((uint)open >> 0x18);
          uVar55 = (undefined1)((uint)open >> 0x10);
          uVar54 = (undefined1)((uint)open >> 8);
          auVar68._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar56,uVar56),uVar55),CONCAT14(uVar55,open)) >>
                    0x20);
          auVar68[3] = uVar54;
          auVar68[2] = uVar54;
          auVar68[0] = (undefined1)open;
          auVar68[1] = auVar68[0];
          auVar68._8_8_ = 0;
          auVar41 = pshuflw(auVar68,auVar68,0);
          local_58 = auVar41._0_4_;
          uVar56 = (undefined1)((uint)gap >> 0x18);
          uVar55 = (undefined1)((uint)gap >> 0x10);
          uVar54 = (undefined1)((uint)gap >> 8);
          auVar79._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar56,uVar56),uVar55),CONCAT14(uVar55,gap)) >> 0x20
                    );
          auVar79[3] = uVar54;
          auVar79[2] = uVar54;
          auVar79[0] = (undefined1)gap;
          auVar79[1] = auVar79[0];
          auVar79._8_8_ = 0;
          auVar41 = pshuflw(auVar79,auVar79,0);
          local_68 = auVar41._0_4_;
          auVar41 = pshuflw(ZEXT416(uVar27),ZEXT416(uVar27),0);
          local_98 = auVar41._0_4_;
          auVar41 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
          local_78 = auVar41._0_4_;
          uVar36 = 1;
          if (1 < s2Len) {
            uVar36 = (ulong)(uint)s2Len;
          }
          uVar15 = 0;
          do {
            ptr[uVar15 + 0xf] = (int8_t)matrix->mapper[(byte)_s2[uVar15]];
            uVar15 = uVar15 + 1;
          } while (uVar36 != uVar15);
          uVar15 = 0;
          ptr[7] = '\0';
          ptr[8] = '\0';
          ptr[9] = '\0';
          ptr[10] = '\0';
          ptr[0xb] = '\0';
          ptr[0xc] = '\0';
          ptr[0xd] = '\0';
          ptr[0xe] = '\0';
          ptr[0] = '\0';
          ptr[1] = '\0';
          ptr[2] = '\0';
          ptr[3] = '\0';
          ptr[4] = '\0';
          ptr[5] = '\0';
          ptr[6] = '\0';
          ptr[7] = '\0';
          uVar11 = s2Len + 1U;
          if ((int)(s2Len + 1U) < (int)uVar17) {
            uVar11 = uVar17;
          }
          cStack_114 = local_118;
          cStack_113 = cStack_117;
          cStack_112 = cStack_116;
          cStack_111 = cStack_115;
          cStack_110 = local_118;
          cStack_10f = cStack_117;
          cStack_10e = cStack_116;
          cStack_10d = cStack_115;
          cStack_10c = local_118;
          cStack_10b = cStack_117;
          cStack_10a = cStack_116;
          cStack_109 = cStack_115;
          uStack_94 = local_98;
          uStack_90 = local_98;
          uStack_8c = local_98;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uStack_64 = local_68;
          uStack_60 = local_68;
          uStack_5c = local_68;
          uStack_54 = local_58;
          uStack_50 = local_58;
          uStack_4c = local_58;
          memset(ptr + (ulong)(uint)s2Len + 0xf,0,(ulong)(~s2Len + uVar11) + 1);
          do {
            ptr_00[uVar15 + 0xf] = '\0';
            ptr_01[uVar15 + 0xf] = cVar10;
            uVar15 = uVar15 + 1;
          } while (uVar36 != uVar15);
          lVar16 = 0;
          do {
            ptr_00[lVar16] = cVar10;
            ptr_01[lVar16] = cVar10;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0xf);
          lVar16 = (ulong)(uint)s2Len + 0xf;
          do {
            ptr_00[lVar16] = cVar10;
            ptr_01[lVar16] = cVar10;
            lVar16 = lVar16 + 1;
            s2Len = s2Len + 1;
          } while (s2Len < (int)uVar17);
          if ((int)uVar27 < 1) {
            local_178[4] = local_1c8;
            local_178._0_4_ = uVar40;
            local_178[5] = cStack_1c7;
            local_178[6] = cStack_1c6;
            local_178[7] = cStack_1c5;
            local_178[0xc] = local_1c8;
            local_178._8_4_ = uVar40;
            local_178[0xd] = cStack_1c7;
            local_178[0xe] = cStack_1c6;
            local_178[0xf] = cStack_1c5;
            local_188[1] = cStack_117;
            local_188[0] = local_118;
            local_188[2] = cStack_116;
            local_188[3] = cStack_115;
            local_188[4] = cStack_114;
            local_188[5] = cStack_113;
            local_188[6] = cStack_112;
            local_188[7] = cStack_111;
            local_188[9] = cStack_10f;
            local_188[8] = cStack_110;
            local_188[10] = cStack_10e;
            local_188[0xb] = cStack_10d;
            local_188[0xc] = cStack_10c;
            local_188[0xd] = cStack_10b;
            local_188[0xe] = cStack_10a;
            local_188[0xf] = cStack_109;
          }
          else {
            local_c0 = 1;
            if (1 < (int)uVar17) {
              local_c0 = (ulong)uVar17;
            }
            uVar27 = uVar27 - 1;
            local_1f8 = 7;
            sStack_1f6 = 6;
            sStack_1f4 = 5;
            sStack_1f2 = 4;
            sStack_1f0 = 3;
            sStack_1ee = 2;
            sStack_1ec = 1;
            sStack_1ea = 0;
            local_168 = 0xf;
            sStack_166 = 0xe;
            sStack_164 = 0xd;
            sStack_162 = 0xc;
            sStack_160 = 0xb;
            sStack_15e = 10;
            sStack_15c = 9;
            sStack_15a = 8;
            uVar36 = 0;
            local_188[1] = cStack_117;
            local_188[0] = local_118;
            local_188[2] = cStack_116;
            local_188[3] = cStack_115;
            local_188[4] = cStack_114;
            local_188[5] = cStack_113;
            local_188[6] = cStack_112;
            local_188[7] = cStack_111;
            local_188[9] = cStack_10f;
            local_188[8] = cStack_110;
            local_188[10] = cStack_10e;
            local_188[0xb] = cStack_10d;
            local_188[0xc] = cStack_10c;
            local_188[0xd] = cStack_10b;
            local_188[0xe] = cStack_10a;
            local_188[0xf] = cStack_109;
            local_178[4] = local_1c8;
            local_178._0_4_ = uVar40;
            local_178[5] = cStack_1c7;
            local_178[6] = cStack_1c6;
            local_178[7] = cStack_1c5;
            local_178[0xc] = local_1c8;
            local_178._8_4_ = uVar40;
            local_178[0xd] = cStack_1c7;
            local_178[0xe] = cStack_1c6;
            local_178[0xf] = cStack_1c5;
            do {
              iVar13 = matrix->type;
              uVar11 = (uint)uVar36;
              uVar17 = uVar11;
              if (iVar13 == 0) {
                uVar17 = (uint)ptr_02[uVar36];
              }
              if (iVar13 == 0) {
                uVar20 = (int)ptr_02[uVar36 | 1];
              }
              else {
                uVar20 = uVar11 | 1;
                if (uVar37 <= (uVar36 | 1)) {
                  uVar20 = uVar27;
                }
              }
              if (iVar13 == 0) {
                uVar23 = (int)ptr_02[uVar36 | 2];
              }
              else {
                uVar23 = uVar11 | 2;
                if (uVar37 <= (uVar36 | 2)) {
                  uVar23 = uVar27;
                }
              }
              if (iVar13 == 0) {
                uVar31 = (int)ptr_02[uVar36 | 3];
              }
              else {
                uVar31 = uVar11 | 3;
                if (uVar37 <= (uVar36 | 3)) {
                  uVar31 = uVar27;
                }
              }
              if (iVar13 == 0) {
                uVar33 = (int)ptr_02[uVar36 | 4];
              }
              else {
                uVar33 = uVar11 | 4;
                if (uVar37 <= (uVar36 | 4)) {
                  uVar33 = uVar27;
                }
              }
              if (iVar13 == 0) {
                uVar22 = (int)ptr_02[uVar36 | 5];
              }
              else {
                uVar22 = uVar11 | 5;
                if (uVar37 <= (uVar36 | 5)) {
                  uVar22 = uVar27;
                }
              }
              if (iVar13 == 0) {
                uVar35 = (int)ptr_02[uVar36 | 6];
              }
              else {
                uVar35 = uVar11 | 6;
                if (uVar37 <= (uVar36 | 6)) {
                  uVar35 = uVar27;
                }
              }
              piVar1 = matrix->matrix;
              iVar19 = matrix->size;
              if (iVar13 == 0) {
                uVar38 = (int)ptr_02[uVar36 | 7];
              }
              else {
                uVar38 = uVar11 | 7;
                if (uVar37 <= (uVar36 | 7)) {
                  uVar38 = uVar27;
                }
              }
              if (iVar13 == 0) {
                uVar18 = (int)ptr_02[uVar36 | 8];
              }
              else {
                uVar18 = uVar11 | 8;
                if (uVar37 <= (uVar36 | 8)) {
                  uVar18 = uVar27;
                }
              }
              if (iVar13 == 0) {
                uVar21 = (int)ptr_02[uVar36 | 9];
              }
              else {
                uVar21 = uVar11 | 9;
                if (uVar37 <= (uVar36 | 9)) {
                  uVar21 = uVar27;
                }
              }
              if (iVar13 == 0) {
                uVar24 = (int)ptr_02[uVar36 | 10];
              }
              else {
                uVar24 = uVar11 | 10;
                if (uVar37 <= (uVar36 | 10)) {
                  uVar24 = uVar27;
                }
              }
              if (iVar13 == 0) {
                uVar12 = (int)ptr_02[uVar36 | 0xb];
              }
              else {
                uVar12 = uVar11 | 0xb;
                if (uVar37 <= (uVar36 | 0xb)) {
                  uVar12 = uVar27;
                }
              }
              if (iVar13 == 0) {
                uVar39 = (int)ptr_02[uVar36 | 0xc];
              }
              else {
                uVar39 = uVar11 | 0xc;
                if (uVar37 <= (uVar36 | 0xc)) {
                  uVar39 = uVar27;
                }
              }
              if (iVar13 == 0) {
                uVar32 = (int)ptr_02[uVar36 | 0xd];
              }
              else {
                uVar32 = uVar11 | 0xd;
                if (uVar37 <= (uVar36 | 0xd)) {
                  uVar32 = uVar27;
                }
              }
              if (iVar13 == 0) {
                uVar28 = (int)ptr_02[uVar36 | 0xe];
              }
              else {
                uVar28 = uVar11 | 0xe;
                if (uVar37 <= (uVar36 | 0xe)) {
                  uVar28 = uVar27;
                }
              }
              if (iVar13 == 0) {
                uVar11 = (int)ptr_02[uVar36 | 0xf];
              }
              else {
                uVar11 = uVar11 | 0xf;
                if (uVar37 <= (uVar36 | 0xf)) {
                  uVar11 = uVar27;
                }
              }
              local_a0 = piVar1 + (int)(uVar23 * iVar19);
              local_a8 = piVar1 + (int)(uVar31 * iVar19);
              local_b0 = piVar1 + (int)(uVar33 * iVar19);
              local_b8 = piVar1 + (int)(uVar22 * iVar19);
              auVar110._0_2_ = -(ushort)(local_168 < (short)local_98);
              auVar110._2_2_ = -(ushort)(sStack_166 < local_98._2_2_);
              auVar110._4_2_ = -(ushort)(sStack_164 < (short)uStack_94);
              auVar110._6_2_ = -(ushort)(sStack_162 < uStack_94._2_2_);
              auVar110._8_2_ = -(ushort)(sStack_160 < (short)uStack_90);
              auVar110._10_2_ = -(ushort)(sStack_15e < uStack_90._2_2_);
              auVar110._12_2_ = -(ushort)(sStack_15c < (short)uStack_8c);
              auVar110._14_2_ = -(ushort)(sStack_15a < uStack_8c._2_2_);
              auVar78._0_2_ = -(ushort)(local_1f8 < (short)local_98);
              auVar78._2_2_ = -(ushort)(sStack_1f6 < local_98._2_2_);
              auVar78._4_2_ = -(ushort)(sStack_1f4 < (short)uStack_94);
              auVar78._6_2_ = -(ushort)(sStack_1f2 < uStack_94._2_2_);
              auVar78._8_2_ = -(ushort)(sStack_1f0 < (short)uStack_90);
              auVar78._10_2_ = -(ushort)(sStack_1ee < uStack_90._2_2_);
              auVar78._12_2_ = -(ushort)(sStack_1ec < (short)uStack_8c);
              auVar78._14_2_ = -(ushort)(sStack_1ea < uStack_8c._2_2_);
              local_108 = packsswb(auVar110,auVar78);
              local_e8[4] = local_1c8;
              local_e8._0_4_ = uVar40;
              local_e8[5] = cStack_1c7;
              local_e8[6] = cStack_1c6;
              local_e8[7] = cStack_1c5;
              local_e8[8] = local_1c8;
              local_e8[9] = cStack_1c7;
              local_e8[10] = cStack_1c6;
              local_e8[0xb] = cStack_1c5;
              local_e8[0xc] = local_1c8;
              local_e8[0xd] = cStack_1c7;
              local_e8[0xe] = cStack_1c6;
              local_e8[0xf] = cStack_1c5;
              local_268 = local_88;
              uVar15 = 0;
              auVar95 = _DAT_008d0c80;
              auVar41 = local_e8;
              sVar97 = -7;
              sVar99 = -6;
              sVar100 = -5;
              sVar101 = -4;
              sVar102 = -3;
              sVar103 = -2;
              sVar104 = -1;
              sVar105 = 0;
              local_1b8._0_8_ = local_88._0_8_;
              local_1b8._8_8_ = local_88._8_8_;
              do {
                sStack_ea = sVar105;
                sStack_ec = sVar104;
                sStack_ee = sVar103;
                sStack_f0 = sVar102;
                sStack_f2 = sVar101;
                sStack_f4 = sVar100;
                sStack_f6 = sVar99;
                local_f8 = sVar97;
                local_158 = local_148;
                local_d8 = local_138;
                auVar109[0xf] = (char)piVar1[(long)(int)(uVar17 * iVar19) + (long)ptr[uVar15 + 0xf]]
                ;
                auVar109[0xe] = (char)piVar1[(long)(int)(uVar20 * iVar19) + (long)ptr[uVar15 + 0xe]]
                ;
                auVar109[0xd] = (char)local_a0[ptr[uVar15 + 0xd]];
                auVar109[0xc] = (char)local_a8[ptr[uVar15 + 0xc]];
                auVar109[0xb] = (char)local_b0[ptr[uVar15 + 0xb]];
                auVar109[10] = (char)local_b8[ptr[uVar15 + 10]];
                auVar109[9] = (char)piVar1[(long)(int)(uVar35 * iVar19) + (long)ptr[uVar15 + 9]];
                auVar109[8] = (char)piVar1[(long)(int)(uVar38 * iVar19) + (long)ptr[uVar15 + 8]];
                auVar109[7] = (char)piVar1[(long)(int)(uVar18 * iVar19) + (long)ptr[uVar15 + 7]];
                auVar109[6] = (char)piVar1[(long)(int)(uVar21 * iVar19) + (long)ptr[uVar15 + 6]];
                auVar109[5] = (char)piVar1[(long)(int)(uVar24 * iVar19) + (long)ptr[uVar15 + 5]];
                auVar109[4] = (char)piVar1[(long)(int)(uVar12 * iVar19) + (long)ptr[uVar15 + 4]];
                auVar109[3] = (char)piVar1[(long)(int)(uVar39 * iVar19) + (long)ptr[uVar15 + 3]];
                auVar109[2] = (char)piVar1[(long)(int)(uVar32 * iVar19) + (long)ptr[uVar15 + 2]];
                auVar109[0] = (undefined1)piVar1[(long)(int)(uVar11 * iVar19) + (long)ptr[uVar15]];
                auVar109[1] = (char)piVar1[(long)(int)(uVar28 * iVar19) + (long)ptr[uVar15 + 1]];
                auVar110 = paddsb(auVar109,local_1b8);
                auVar78 = ZEXT116((byte)ptr_00[uVar15 + 0xf]) << 0x78 | local_268 >> 8;
                auVar9._4_4_ = uStack_54;
                auVar9._0_4_ = local_58;
                auVar9._8_4_ = uStack_50;
                auVar9._12_4_ = uStack_4c;
                auVar79 = psubsb(auVar78,auVar9);
                auVar8._4_4_ = uStack_64;
                auVar8._0_4_ = local_68;
                auVar8._8_4_ = uStack_60;
                auVar8._12_4_ = uStack_5c;
                auVar68 = psubsb(ZEXT116((byte)ptr_01[uVar15 + 0xf]) << 0x78 | local_e8 >> 8,auVar8)
                ;
                auVar42[0] = -(auVar68[0] < auVar79[0]);
                auVar42[1] = -(auVar68[1] < auVar79[1]);
                auVar42[2] = -(auVar68[2] < auVar79[2]);
                auVar42[3] = -(auVar68[3] < auVar79[3]);
                auVar42[4] = -(auVar68[4] < auVar79[4]);
                auVar42[5] = -(auVar68[5] < auVar79[5]);
                auVar42[6] = -(auVar68[6] < auVar79[6]);
                auVar42[7] = -(auVar68[7] < auVar79[7]);
                auVar42[8] = -(auVar68[8] < auVar79[8]);
                auVar42[9] = -(auVar68[9] < auVar79[9]);
                auVar42[10] = -(auVar68[10] < auVar79[10]);
                auVar42[0xb] = -(auVar68[0xb] < auVar79[0xb]);
                auVar42[0xc] = -(auVar68[0xc] < auVar79[0xc]);
                auVar42[0xd] = -(auVar68[0xd] < auVar79[0xd]);
                auVar42[0xe] = -(auVar68[0xe] < auVar79[0xe]);
                auVar42[0xf] = -(auVar68[0xf] < auVar79[0xf]);
                auVar68 = ~auVar42 & auVar68 | auVar79 & auVar42;
                auVar79 = psubsb(local_268,auVar9);
                auVar41 = psubsb(auVar41,auVar8);
                auVar63[0] = -(auVar41[0] < auVar79[0]);
                auVar63[1] = -(auVar41[1] < auVar79[1]);
                auVar63[2] = -(auVar41[2] < auVar79[2]);
                auVar63[3] = -(auVar41[3] < auVar79[3]);
                auVar63[4] = -(auVar41[4] < auVar79[4]);
                auVar63[5] = -(auVar41[5] < auVar79[5]);
                auVar63[6] = -(auVar41[6] < auVar79[6]);
                auVar63[7] = -(auVar41[7] < auVar79[7]);
                auVar63[8] = -(auVar41[8] < auVar79[8]);
                auVar63[9] = -(auVar41[9] < auVar79[9]);
                auVar63[10] = -(auVar41[10] < auVar79[10]);
                auVar63[0xb] = -(auVar41[0xb] < auVar79[0xb]);
                auVar63[0xc] = -(auVar41[0xc] < auVar79[0xc]);
                auVar63[0xd] = -(auVar41[0xd] < auVar79[0xd]);
                auVar63[0xe] = -(auVar41[0xe] < auVar79[0xe]);
                auVar63[0xf] = -(auVar41[0xf] < auVar79[0xf]);
                auVar79 = ~auVar63 & auVar41 | auVar79 & auVar63;
                auVar57[0] = -(auVar79[0] < auVar110[0]);
                auVar57[1] = -(auVar79[1] < auVar110[1]);
                auVar57[2] = -(auVar79[2] < auVar110[2]);
                auVar57[3] = -(auVar79[3] < auVar110[3]);
                auVar57[4] = -(auVar79[4] < auVar110[4]);
                auVar57[5] = -(auVar79[5] < auVar110[5]);
                auVar57[6] = -(auVar79[6] < auVar110[6]);
                auVar57[7] = -(auVar79[7] < auVar110[7]);
                auVar57[8] = -(auVar79[8] < auVar110[8]);
                auVar57[9] = -(auVar79[9] < auVar110[9]);
                auVar57[10] = -(auVar79[10] < auVar110[10]);
                auVar57[0xb] = -(auVar79[0xb] < auVar110[0xb]);
                auVar57[0xc] = -(auVar79[0xc] < auVar110[0xc]);
                auVar57[0xd] = -(auVar79[0xd] < auVar110[0xd]);
                auVar57[0xe] = -(auVar79[0xe] < auVar110[0xe]);
                auVar57[0xf] = -(auVar79[0xf] < auVar110[0xf]);
                auVar41 = ~auVar57 & auVar79 | auVar110 & auVar57;
                auVar66[0] = -(auVar68[0] < auVar41[0]);
                auVar66[1] = -(auVar68[1] < auVar41[1]);
                auVar66[2] = -(auVar68[2] < auVar41[2]);
                auVar66[3] = -(auVar68[3] < auVar41[3]);
                auVar66[4] = -(auVar68[4] < auVar41[4]);
                auVar66[5] = -(auVar68[5] < auVar41[5]);
                auVar66[6] = -(auVar68[6] < auVar41[6]);
                auVar66[7] = -(auVar68[7] < auVar41[7]);
                auVar66[8] = -(auVar68[8] < auVar41[8]);
                auVar66[9] = -(auVar68[9] < auVar41[9]);
                auVar66[10] = -(auVar68[10] < auVar41[10]);
                auVar66[0xb] = -(auVar68[0xb] < auVar41[0xb]);
                auVar66[0xc] = -(auVar68[0xc] < auVar41[0xc]);
                auVar66[0xd] = -(auVar68[0xd] < auVar41[0xd]);
                auVar66[0xe] = -(auVar68[0xe] < auVar41[0xe]);
                auVar66[0xf] = -(auVar68[0xf] < auVar41[0xf]);
                auVar41 = ~auVar66 & auVar68 | auVar41 & auVar66;
                auVar58[0] = -('\0' < auVar41[0]);
                auVar58[1] = -('\0' < auVar41[1]);
                auVar58[2] = -('\0' < auVar41[2]);
                auVar58[3] = -('\0' < auVar41[3]);
                auVar58[4] = -('\0' < auVar41[4]);
                auVar58[5] = -('\0' < auVar41[5]);
                auVar58[6] = -('\0' < auVar41[6]);
                auVar58[7] = -('\0' < auVar41[7]);
                auVar58[8] = -('\0' < auVar41[8]);
                auVar58[9] = -('\0' < auVar41[9]);
                auVar58[10] = -('\0' < auVar41[10]);
                auVar58[0xb] = -('\0' < auVar41[0xb]);
                auVar58[0xc] = -('\0' < auVar41[0xc]);
                auVar58[0xd] = -('\0' < auVar41[0xd]);
                auVar58[0xe] = -('\0' < auVar41[0xe]);
                auVar58[0xf] = -('\0' < auVar41[0xf]);
                sVar97 = auVar95._0_2_;
                auVar98._0_2_ = -(ushort)(sVar97 == -1);
                sVar99 = auVar95._2_2_;
                auVar98._2_2_ = -(ushort)(sVar99 == -1);
                sVar100 = auVar95._4_2_;
                auVar98._4_2_ = -(ushort)(sVar100 == -1);
                sVar101 = auVar95._6_2_;
                auVar98._6_2_ = -(ushort)(sVar101 == -1);
                sVar102 = auVar95._8_2_;
                auVar98._8_2_ = -(ushort)(sVar102 == -1);
                sVar103 = auVar95._10_2_;
                auVar98._10_2_ = -(ushort)(sVar103 == -1);
                sVar104 = auVar95._12_2_;
                sVar105 = auVar95._14_2_;
                auVar98._12_2_ = -(ushort)(sVar104 == -1);
                auVar98._14_2_ = -(ushort)(sVar105 == -1);
                auVar7._2_2_ = sStack_f6;
                auVar7._0_2_ = local_f8;
                auVar7._4_2_ = sStack_f4;
                auVar7._6_2_ = sStack_f2;
                auVar7._8_2_ = sStack_f0;
                auVar7._10_2_ = sStack_ee;
                auVar7._12_2_ = sStack_ec;
                auVar7._14_2_ = sStack_ea;
                auVar67._0_2_ = -(ushort)(local_f8 == -1);
                auVar67._2_2_ = -(ushort)(sStack_f6 == -1);
                auVar67._4_2_ = -(ushort)(sStack_f4 == -1);
                auVar67._6_2_ = -(ushort)(sStack_f2 == -1);
                auVar67._8_2_ = -(ushort)(sStack_f0 == -1);
                auVar67._10_2_ = -(ushort)(sStack_ee == -1);
                auVar67._12_2_ = -(ushort)(sStack_ec == -1);
                auVar67._14_2_ = -(ushort)(sStack_ea == -1);
                auVar110 = packsswb(auVar98,auVar67);
                local_268 = ~auVar110 & auVar58 & auVar41;
                auVar5[4] = local_1c8;
                auVar5._0_4_ = uVar40;
                auVar5[5] = cStack_1c7;
                auVar5[6] = cStack_1c6;
                auVar5[7] = cStack_1c5;
                auVar5[8] = local_1c8;
                auVar5[9] = cStack_1c7;
                auVar5[10] = cStack_1c6;
                auVar5[0xb] = cStack_1c5;
                auVar5[0xc] = local_1c8;
                auVar5[0xd] = cStack_1c7;
                auVar5[0xe] = cStack_1c6;
                auVar5[0xf] = cStack_1c5;
                local_e8 = ~auVar110 & auVar68 | auVar110 & auVar5;
                cVar34 = local_268[0];
                cVar80 = local_268[1];
                cVar94 = local_268[0xf];
                cVar81 = local_268[2];
                cVar82 = local_268[3];
                cVar83 = local_268[4];
                cVar84 = local_268[5];
                cVar85 = local_268[6];
                cVar86 = local_268[7];
                cVar87 = local_268[8];
                cVar88 = local_268[9];
                cVar89 = local_268[10];
                cVar90 = local_268[0xb];
                cVar91 = local_268[0xc];
                cVar92 = local_268[0xd];
                cVar93 = local_268[0xe];
                if (0xf < uVar15) {
                  auVar59[0] = -(cVar34 < local_188[0]);
                  auVar59[1] = -(cVar80 < local_188[1]);
                  auVar59[2] = -(cVar81 < local_188[2]);
                  auVar59[3] = -(cVar82 < local_188[3]);
                  auVar59[4] = -(cVar83 < local_188[4]);
                  auVar59[5] = -(cVar84 < local_188[5]);
                  auVar59[6] = -(cVar85 < local_188[6]);
                  auVar59[7] = -(cVar86 < local_188[7]);
                  auVar59[8] = -(cVar87 < local_188[8]);
                  auVar59[9] = -(cVar88 < local_188[9]);
                  auVar59[10] = -(cVar89 < local_188[10]);
                  auVar59[0xb] = -(cVar90 < local_188[0xb]);
                  auVar59[0xc] = -(cVar91 < local_188[0xc]);
                  auVar59[0xd] = -(cVar92 < local_188[0xd]);
                  auVar59[0xe] = -(cVar93 < local_188[0xe]);
                  auVar59[0xf] = -(cVar94 < local_188[0xf]);
                  local_188 = ~auVar59 & local_188 | local_268 & auVar59;
                  auVar64[0] = -(cVar34 < local_178[0]);
                  auVar64[1] = -(cVar80 < local_178[1]);
                  auVar64[2] = -(cVar81 < local_178[2]);
                  auVar64[3] = -(cVar82 < local_178[3]);
                  auVar64[4] = -(cVar83 < local_178[4]);
                  auVar64[5] = -(cVar84 < local_178[5]);
                  auVar64[6] = -(cVar85 < local_178[6]);
                  auVar64[7] = -(cVar86 < local_178[7]);
                  auVar64[8] = -(cVar87 < local_178[8]);
                  auVar64[9] = -(cVar88 < local_178[9]);
                  auVar64[10] = -(cVar89 < local_178[10]);
                  auVar64[0xb] = -(cVar90 < local_178[0xb]);
                  auVar64[0xc] = -(cVar91 < local_178[0xc]);
                  auVar64[0xd] = -(cVar92 < local_178[0xd]);
                  auVar64[0xe] = -(cVar93 < local_178[0xe]);
                  auVar64[0xf] = -(cVar94 < local_178[0xf]);
                  local_178 = local_178 & auVar64 | ~auVar64 & local_268;
                }
                auVar41 = ~auVar110 & auVar79 | auVar110 & auVar5;
                auVar43._0_2_ = -(ushort)(-1 < sVar97);
                auVar43._2_2_ = -(ushort)(-1 < sVar99);
                auVar43._4_2_ = -(ushort)(-1 < sVar100);
                auVar43._6_2_ = -(ushort)(-1 < sVar101);
                auVar43._8_2_ = -(ushort)(-1 < sVar102);
                auVar43._10_2_ = -(ushort)(-1 < sVar103);
                auVar43._12_2_ = -(ushort)(-1 < sVar104);
                auVar43._14_2_ = -(ushort)(-1 < sVar105);
                auVar60._0_2_ = -(ushort)(-1 < local_f8);
                auVar60._2_2_ = -(ushort)(-1 < sStack_f6);
                auVar60._4_2_ = -(ushort)(-1 < sStack_f4);
                auVar60._6_2_ = -(ushort)(-1 < sStack_f2);
                auVar60._8_2_ = -(ushort)(-1 < sStack_f0);
                auVar60._10_2_ = -(ushort)(-1 < sStack_ee);
                auVar60._12_2_ = -(ushort)(-1 < sStack_ec);
                auVar60._14_2_ = -(ushort)(-1 < sStack_ea);
                auVar68 = packsswb(auVar43,auVar60);
                auVar69._0_2_ = -(ushort)(sVar97 < (short)local_78);
                auVar69._2_2_ = -(ushort)(sVar99 < local_78._2_2_);
                auVar69._4_2_ = -(ushort)(sVar100 < (short)uStack_74);
                auVar69._6_2_ = -(ushort)(sVar101 < uStack_74._2_2_);
                auVar69._8_2_ = -(ushort)(sVar102 < (short)uStack_70);
                auVar69._10_2_ = -(ushort)(sVar103 < uStack_70._2_2_);
                auVar69._12_2_ = -(ushort)(sVar104 < (short)uStack_6c);
                auVar69._14_2_ = -(ushort)(sVar105 < uStack_6c._2_2_);
                auVar61._0_2_ = -(ushort)(local_f8 < (short)local_78);
                auVar61._2_2_ = -(ushort)(sStack_f6 < local_78._2_2_);
                auVar61._4_2_ = -(ushort)(sStack_f4 < (short)uStack_74);
                auVar61._6_2_ = -(ushort)(sStack_f2 < uStack_74._2_2_);
                auVar61._8_2_ = -(ushort)(sStack_f0 < (short)uStack_70);
                auVar61._10_2_ = -(ushort)(sStack_ee < uStack_70._2_2_);
                auVar61._12_2_ = -(ushort)(sStack_ec < (short)uStack_6c);
                auVar61._14_2_ = -(ushort)(sStack_ea < uStack_6c._2_2_);
                auVar79 = packsswb(auVar69,auVar61);
                auVar68 = auVar79 & local_108 & auVar68;
                auVar107[0] = -(cVar34 == local_128[0]);
                auVar107[1] = -(cVar80 == local_128[1]);
                auVar107[2] = -(cVar81 == local_128[2]);
                auVar107[3] = -(cVar82 == local_128[3]);
                auVar107[4] = -(cVar83 == local_128[4]);
                auVar107[5] = -(cVar84 == local_128[5]);
                auVar107[6] = -(cVar85 == local_128[6]);
                auVar107[7] = -(cVar86 == local_128[7]);
                auVar107[8] = -(cVar87 == local_128[8]);
                auVar107[9] = -(cVar88 == local_128[9]);
                auVar107[10] = -(cVar89 == local_128[10]);
                auVar107[0xb] = -(cVar90 == local_128[0xb]);
                auVar107[0xc] = -(cVar91 == local_128[0xc]);
                auVar107[0xd] = -(cVar92 == local_128[0xd]);
                auVar107[0xe] = -(cVar93 == local_128[0xe]);
                auVar107[0xf] = -(cVar94 == local_128[0xf]);
                auVar96[0] = -(local_128[0] < cVar34);
                auVar96[1] = -(local_128[1] < cVar80);
                auVar96[2] = -(local_128[2] < cVar81);
                auVar96[3] = -(local_128[3] < cVar82);
                auVar96[4] = -(local_128[4] < cVar83);
                auVar96[5] = -(local_128[5] < cVar84);
                auVar96[6] = -(local_128[6] < cVar85);
                auVar96[7] = -(local_128[7] < cVar86);
                auVar96[8] = -(local_128[8] < cVar87);
                auVar96[9] = -(local_128[9] < cVar88);
                auVar96[10] = -(local_128[10] < cVar89);
                auVar96[0xb] = -(local_128[0xb] < cVar90);
                auVar96[0xc] = -(local_128[0xc] < cVar91);
                auVar96[0xd] = -(local_128[0xd] < cVar92);
                auVar96[0xe] = -(local_128[0xe] < cVar93);
                auVar96[0xf] = -(local_128[0xf] < cVar94);
                auVar96 = auVar96 & auVar68;
                auVar65[1] = auVar96[8];
                auVar65[0] = auVar96[8];
                auVar65[2] = auVar96[9];
                auVar65[3] = auVar96[9];
                auVar65[4] = auVar96[10];
                auVar65[5] = auVar96[10];
                auVar65[6] = auVar96[0xb];
                auVar65[7] = auVar96[0xb];
                auVar65[8] = auVar96[0xc];
                auVar65[9] = auVar96[0xc];
                auVar65[10] = auVar96[0xd];
                auVar65[0xb] = auVar96[0xd];
                auVar65[0xc] = auVar96[0xe];
                auVar65[0xd] = auVar96[0xe];
                auVar65[0xf] = auVar96[0xf];
                auVar65[0xe] = auVar65[0xf];
                auVar3._2_2_ = sStack_1f6;
                auVar3._0_2_ = local_1f8;
                auVar3._4_2_ = sStack_1f4;
                auVar3._6_2_ = sStack_1f2;
                auVar3._8_2_ = sStack_1f0;
                auVar3._10_2_ = sStack_1ee;
                auVar3._12_2_ = sStack_1ec;
                auVar3._14_2_ = sStack_1ea;
                auVar106._0_2_ = -(ushort)(sVar97 < local_d8._0_2_);
                auVar106._2_2_ = -(ushort)(sVar99 < local_d8._2_2_);
                auVar106._4_2_ = -(ushort)(sVar100 < local_d8._4_2_);
                auVar106._6_2_ = -(ushort)(sVar101 < local_d8._6_2_);
                auVar106._8_2_ = -(ushort)(sVar102 < local_d8._8_2_);
                auVar106._10_2_ = -(ushort)(sVar103 < local_d8._10_2_);
                auVar106._12_2_ = -(ushort)(sVar104 < local_d8._12_2_);
                auVar106._14_2_ = -(ushort)(sVar105 < local_d8._14_2_);
                auVar44._0_2_ = -(ushort)(local_f8 < local_158._0_2_);
                auVar44._2_2_ = -(ushort)(sStack_f6 < local_158._2_2_);
                auVar44._4_2_ = -(ushort)(sStack_f4 < local_158._4_2_);
                auVar44._6_2_ = -(ushort)(sStack_f2 < local_158._6_2_);
                auVar44._8_2_ = -(ushort)(sStack_f0 < local_158._8_2_);
                auVar44._10_2_ = -(ushort)(sStack_ee < local_158._10_2_);
                auVar44._12_2_ = -(ushort)(sStack_ec < local_158._12_2_);
                auVar44._14_2_ = -(ushort)(sStack_ea < local_158._14_2_);
                auVar79 = packsswb(auVar106,auVar44);
                auVar52._0_14_ = auVar96._0_14_;
                auVar52[0xe] = auVar96[7];
                auVar52[0xf] = auVar96[7];
                auVar51._14_2_ = auVar52._14_2_;
                auVar51._0_13_ = auVar96._0_13_;
                auVar51[0xd] = auVar96[6];
                auVar50._13_3_ = auVar51._13_3_;
                auVar50._0_12_ = auVar96._0_12_;
                auVar50[0xc] = auVar96[6];
                auVar49._12_4_ = auVar50._12_4_;
                auVar49._0_11_ = auVar96._0_11_;
                auVar49[0xb] = auVar96[5];
                auVar48._11_5_ = auVar49._11_5_;
                auVar48._0_10_ = auVar96._0_10_;
                auVar48[10] = auVar96[5];
                auVar47._10_6_ = auVar48._10_6_;
                auVar47._0_9_ = auVar96._0_9_;
                auVar47[9] = auVar96[4];
                auVar46._9_7_ = auVar47._9_7_;
                auVar46._0_8_ = auVar96._0_8_;
                auVar46[8] = auVar96[4];
                auVar45._8_8_ = auVar46._8_8_;
                auVar45[7] = auVar96[3];
                auVar45[6] = auVar96[3];
                auVar45[5] = auVar96[2];
                auVar45[4] = auVar96[2];
                auVar45[3] = auVar96[1];
                auVar45[2] = auVar96[1];
                auVar45[0] = auVar96[0];
                auVar45[1] = auVar45[0];
                local_128 = ~auVar96 & local_128 | local_268 & auVar96;
                auVar6._2_2_ = sStack_166;
                auVar6._0_2_ = local_168;
                auVar6._4_2_ = sStack_164;
                auVar6._6_2_ = sStack_162;
                auVar6._8_2_ = sStack_160;
                auVar6._10_2_ = sStack_15e;
                auVar6._12_2_ = sStack_15c;
                auVar6._14_2_ = sStack_15a;
                auVar107 = auVar79 & auVar68 & auVar107;
                auVar77._0_14_ = auVar107._0_14_;
                auVar77[0xe] = auVar107[7];
                auVar77[0xf] = auVar107[7];
                auVar76._14_2_ = auVar77._14_2_;
                auVar76._0_13_ = auVar107._0_13_;
                auVar76[0xd] = auVar107[6];
                auVar75._13_3_ = auVar76._13_3_;
                auVar75._0_12_ = auVar107._0_12_;
                auVar75[0xc] = auVar107[6];
                auVar74._12_4_ = auVar75._12_4_;
                auVar74._0_11_ = auVar107._0_11_;
                auVar74[0xb] = auVar107[5];
                auVar73._11_5_ = auVar74._11_5_;
                auVar73._0_10_ = auVar107._0_10_;
                auVar73[10] = auVar107[5];
                auVar72._10_6_ = auVar73._10_6_;
                auVar72._0_9_ = auVar107._0_9_;
                auVar72[9] = auVar107[4];
                auVar71._9_7_ = auVar72._9_7_;
                auVar71._0_8_ = auVar107._0_8_;
                auVar71[8] = auVar107[4];
                auVar70._8_8_ = auVar71._8_8_;
                auVar70[7] = auVar107[3];
                auVar70[6] = auVar107[3];
                auVar70[5] = auVar107[2];
                auVar70[4] = auVar107[2];
                auVar70[3] = auVar107[1];
                auVar70[2] = auVar107[1];
                auVar70[0] = auVar107[0];
                auVar70[1] = auVar70[0];
                auVar108[1] = auVar107[8];
                auVar108[0] = auVar107[8];
                auVar108[2] = auVar107[9];
                auVar108[3] = auVar107[9];
                auVar108[4] = auVar107[10];
                auVar108[5] = auVar107[10];
                auVar108[6] = auVar107[0xb];
                auVar108[7] = auVar107[0xb];
                auVar108[8] = auVar107[0xc];
                auVar108[9] = auVar107[0xc];
                auVar108[10] = auVar107[0xd];
                auVar108[0xb] = auVar107[0xd];
                auVar108[0xc] = auVar107[0xe];
                auVar108[0xd] = auVar107[0xe];
                auVar108[0xf] = auVar107[0xf];
                auVar108[0xe] = auVar108[0xf];
                local_198 = auVar6 & auVar70 | ~auVar70 & (auVar6 & auVar45 | ~auVar45 & local_198);
                auVar4._2_2_ = sStack_1f6;
                auVar4._0_2_ = local_1f8;
                auVar4._4_2_ = sStack_1f4;
                auVar4._6_2_ = sStack_1f2;
                auVar4._8_2_ = sStack_1f0;
                auVar4._10_2_ = sStack_1ee;
                auVar4._12_2_ = sStack_1ec;
                auVar4._14_2_ = sStack_1ea;
                local_1a8 = auVar4 & auVar108 |
                            ~auVar108 & (auVar3 & auVar65 | ~auVar65 & local_1a8);
                local_138 = ~auVar70 & (~auVar45 & local_d8 | auVar95 & auVar45) | auVar95 & auVar70
                ;
                local_148 = ~auVar108 & (~auVar65 & local_158 | auVar7 & auVar65) |
                            auVar7 & auVar108;
                local_48 = local_268._0_8_;
                uStack_40 = local_268._8_8_;
                ptr_00[uVar15] = cVar34;
                ptr_01[uVar15] = local_e8[0];
                auVar95._0_2_ = sVar97 + 1;
                auVar95._2_2_ = sVar99 + 1;
                auVar95._4_2_ = sVar100 + 1;
                auVar95._6_2_ = sVar101 + 1;
                auVar95._8_2_ = sVar102 + 1;
                auVar95._10_2_ = sVar103 + 1;
                auVar95._12_2_ = sVar104 + 1;
                auVar95._14_2_ = sVar105 + 1;
                uVar15 = uVar15 + 1;
                local_1b8._0_8_ = auVar78._0_8_;
                local_1b8._8_8_ = auVar78._8_8_;
                sVar97 = local_f8 + 1;
                sVar99 = sStack_f6 + 1;
                sVar100 = sStack_f4 + 1;
                sVar101 = sStack_f2 + 1;
                sVar102 = sStack_f0 + 1;
                sVar103 = sStack_ee + 1;
                sVar104 = sStack_ec + 1;
                sVar105 = sStack_ea + 1;
              } while (local_c0 != uVar15);
              local_168 = local_168 + 0x10;
              sStack_166 = sStack_166 + 0x10;
              sStack_164 = sStack_164 + 0x10;
              sStack_162 = sStack_162 + 0x10;
              sStack_160 = sStack_160 + 0x10;
              sStack_15e = sStack_15e + 0x10;
              sStack_15c = sStack_15c + 0x10;
              sStack_15a = sStack_15a + 0x10;
              local_1f8 = local_1f8 + 0x10;
              sStack_1f6 = sStack_1f6 + 0x10;
              sStack_1f4 = sStack_1f4 + 0x10;
              sStack_1f2 = sStack_1f2 + 0x10;
              sStack_1f0 = sStack_1f0 + 0x10;
              sStack_1ee = sStack_1ee + 0x10;
              sStack_1ec = sStack_1ec + 0x10;
              sStack_1ea = sStack_1ea + 0x10;
              uVar36 = uVar36 + 0x10;
            } while (uVar36 < uVar37);
          }
          lVar16 = 0;
          iVar30 = 0;
          iVar13 = 0;
          iVar26 = 0;
          iVar19 = 0;
          do {
            cVar34 = local_128[lVar16];
            if (cVar10 < cVar34) {
              iVar13 = (int)*(short *)(local_198 + lVar16 * 2);
              iVar19 = (int)*(short *)(local_138 + lVar16 * 2);
              iVar26 = (int)*(short *)(local_138 + lVar16 * 2);
              iVar30 = (int)*(short *)(local_198 + lVar16 * 2);
              cVar10 = cVar34;
            }
            else if (cVar34 == cVar10) {
              iVar25 = (int)*(short *)(local_138 + lVar16 * 2);
              if (iVar25 < iVar19) {
                iVar13 = (int)*(short *)(local_198 + lVar16 * 2);
                iVar19 = iVar25;
                iVar26 = iVar25;
                iVar30 = (int)*(short *)(local_198 + lVar16 * 2);
              }
              else if (iVar19 == iVar25) {
                iVar29 = (int)*(short *)(local_198 + lVar16 * 2);
                iVar19 = iVar26;
                if (iVar29 < iVar13) {
                  iVar19 = iVar25;
                }
                bVar2 = iVar29 <= iVar13;
                iVar13 = iVar30;
                iVar26 = iVar19;
                if (bVar2) {
                  iVar13 = iVar29;
                  iVar30 = iVar29;
                }
              }
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != 8);
          lVar16 = 0;
          do {
            cVar34 = local_128[lVar16 + 8];
            if (cVar10 < cVar34) {
              iVar13 = (int)*(short *)(local_1a8 + lVar16 * 2);
              iVar19 = (int)*(short *)(local_148 + lVar16 * 2);
              cVar10 = cVar34;
            }
            else if (cVar34 == cVar10) {
              iVar26 = (int)*(short *)(local_148 + lVar16 * 2);
              if (iVar26 < iVar19) {
                iVar13 = (int)*(short *)(local_1a8 + lVar16 * 2);
                iVar19 = iVar26;
              }
              else if (iVar19 == iVar26) {
                iVar30 = (int)*(short *)(local_1a8 + lVar16 * 2);
                if (iVar30 < iVar13) {
                  iVar19 = iVar26;
                }
                if (iVar30 <= iVar13) {
                  iVar13 = iVar30;
                }
              }
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != 8);
          auVar53[0] = -(local_188[0] < local_1c8);
          auVar53[1] = -(local_188[1] < cStack_1c7);
          auVar53[2] = -(local_188[2] < cStack_1c6);
          auVar53[3] = -(local_188[3] < cStack_1c5);
          auVar53[4] = -(local_188[4] < local_1c8);
          auVar53[5] = -(local_188[5] < cStack_1c7);
          auVar53[6] = -(local_188[6] < cStack_1c6);
          auVar53[7] = -(local_188[7] < cStack_1c5);
          auVar53[8] = -(local_188[8] < local_1c8);
          auVar53[9] = -(local_188[9] < cStack_1c7);
          auVar53[10] = -(local_188[10] < cStack_1c6);
          auVar53[0xb] = -(local_188[0xb] < cStack_1c5);
          auVar53[0xc] = -(local_188[0xc] < local_1c8);
          auVar53[0xd] = -(local_188[0xd] < cStack_1c7);
          auVar53[0xe] = -(local_188[0xe] < cStack_1c6);
          auVar53[0xf] = -(local_188[0xf] < cStack_1c5);
          auVar62[0] = -(local_118 < local_178[0]);
          auVar62[1] = -(cStack_117 < local_178[1]);
          auVar62[2] = -(cStack_116 < local_178[2]);
          auVar62[3] = -(cStack_115 < local_178[3]);
          auVar62[4] = -(cStack_114 < local_178[4]);
          auVar62[5] = -(cStack_113 < local_178[5]);
          auVar62[6] = -(cStack_112 < local_178[6]);
          auVar62[7] = -(cStack_111 < local_178[7]);
          auVar62[8] = -(cStack_110 < local_178[8]);
          auVar62[9] = -(cStack_10f < local_178[9]);
          auVar62[10] = -(cStack_10e < local_178[10]);
          auVar62[0xb] = -(cStack_10d < local_178[0xb]);
          auVar62[0xc] = -(cStack_10c < local_178[0xc]);
          auVar62[0xd] = -(cStack_10b < local_178[0xd]);
          auVar62[0xe] = -(cStack_10a < local_178[0xe]);
          auVar62[0xf] = -(cStack_109 < local_178[0xf]);
          auVar62 = auVar62 | auVar53;
          if ((((((((((((((((auVar62 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar62 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar62 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar62 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar62 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar62 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar62 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar62 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar62 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar62 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar62 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar62 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar62[0xf] < '\0') {
            *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
            cVar10 = '\0';
            iVar19 = 0;
            iVar13 = 0;
          }
          ppVar14->score = (int)cVar10;
          ppVar14->end_query = iVar13;
          ppVar14->end_ref = iVar19;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(ptr_02);
            return ppVar14;
          }
          return ppVar14;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int8_t * restrict s1 = NULL;
    int8_t * restrict s2B = NULL;
    int8_t * restrict _H_pr = NULL;
    int8_t * restrict _F_pr = NULL;
    int8_t * restrict s2 = NULL;
    int8_t * restrict H_pr = NULL;
    int8_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne16;
    __m128i vNegOne16;
    __m128i vN16;
    __m128i vILo16;
    __m128i vIHi16;
    __m128i vJresetLo16;
    __m128i vJresetHi16;
    __m128i vMaxH;
    __m128i vEndILo;
    __m128i vEndIHi;
    __m128i vEndJLo;
    __m128i vEndJHi;
    __m128i vILimit16;
    __m128i vJLimit16;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi8(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 1); /* shift in a 0 */
    vOpen = _mm_set1_epi8(open);
    vGap  = _mm_set1_epi8(gap);
    vZero = _mm_set1_epi8(0);
    vOne16 = _mm_set1_epi16(1);
    vNegOne16 = _mm_set1_epi16(-1);
    vN16 = _mm_set1_epi16(N);
    vILo16 = _mm_set_epi16(8,9,10,11,12,13,14,15);
    vIHi16 = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJresetLo16 = _mm_set_epi16(-8,-9,-10,-11,-12,-13,-14,-15);
    vJresetHi16 = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vEndILo = vNegInf;
    vEndIHi = vNegInf;
    vEndJLo = vNegInf;
    vEndJHi = vNegInf;
    vILimit16 = _mm_set1_epi16(s1Len);
    vJLimit16 = _mm_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int8_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int8_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int8_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int8_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJLo16 = vJresetLo16;
        __m128i vJHi16 = vJresetHi16;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m128i vIltLimit = _mm_packs_epi16(
                    _mm_cmplt_epi16(vILo16, vILimit16),
                    _mm_cmplt_epi16(vIHi16, vILimit16));
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 1);
            vNH = _mm_insert_epi8_rpl(vNH, H_pr[j], 15);
            vF = _mm_srli_si128(vF, 1);
            vF = _mm_insert_epi8_rpl(vF, F_pr[j], 15);
            vF = _mm_max_epi8_rpl(
                    _mm_subs_epi8(vNH, vOpen),
                    _mm_subs_epi8(vF, vGap));
            vE = _mm_max_epi8_rpl(
                    _mm_subs_epi8(vWH, vOpen),
                    _mm_subs_epi8(vE, vGap));
            vMat = _mm_set_epi8(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm_adds_epi8(vNWH, vMat);
            vWH = _mm_max_epi8_rpl(vNWH, vE);
            vWH = _mm_max_epi8_rpl(vWH, vF);
            vWH = _mm_max_epi8_rpl(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_packs_epi16(
                        _mm_cmpeq_epi16(vJLo16,vNegOne16),
                        _mm_cmpeq_epi16(vJHi16,vNegOne16));
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int8_t)_mm_extract_epi8_rpl(vWH,0);
            F_pr[j-15] = (int8_t)_mm_extract_epi8_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_packs_epi16(
                            _mm_cmpgt_epi16(vJLo16, vNegOne16),
                            _mm_cmpgt_epi16(vJHi16, vNegOne16)),
                        _mm_packs_epi16(
                            _mm_cmplt_epi16(vJLo16, vJLimit16),
                            _mm_cmplt_epi16(vJHi16, vJLimit16)));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi8(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi8(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_packs_epi16(
                        _mm_cmplt_epi16(vJLo16, vEndJLo),
                        _mm_cmplt_epi16(vJHi16, vEndJHi));
                __m128i cond_lo = _mm_unpacklo_epi8(cond_all, cond_all);
                __m128i cond_hi = _mm_unpackhi_epi8(cond_all, cond_all);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vEndILo = _mm_blendv_epi8_rpl(vEndILo, vILo16, cond_lo);
                vEndIHi = _mm_blendv_epi8_rpl(vEndIHi, vIHi16, cond_hi);
                vEndJLo = _mm_blendv_epi8_rpl(vEndJLo, vJLo16, cond_lo);
                vEndJHi = _mm_blendv_epi8_rpl(vEndJHi, vJHi16, cond_hi);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                cond_lo = _mm_unpacklo_epi8(cond_all, cond_all);
                cond_hi = _mm_unpackhi_epi8(cond_all, cond_all);
                vEndILo = _mm_blendv_epi8_rpl(vEndILo, vILo16, cond_lo);
                vEndIHi = _mm_blendv_epi8_rpl(vEndIHi, vIHi16, cond_hi);
                vEndJLo = _mm_blendv_epi8_rpl(vEndJLo, vJLo16, cond_lo);
                vEndJHi = _mm_blendv_epi8_rpl(vEndJHi, vJHi16, cond_hi);
            }
            vJLo16 = _mm_add_epi16(vJLo16, vOne16);
            vJHi16 = _mm_add_epi16(vJHi16, vOne16);
        }
        vILo16 = _mm_add_epi16(vILo16, vN16);
        vIHi16 = _mm_add_epi16(vIHi16, vN16);
    }

    /* alignment ending position */
    {
        int8_t *t = (int8_t*)&vMaxH;
        int16_t *ilo = (int16_t*)&vEndILo;
        int16_t *jlo = (int16_t*)&vEndJLo;
        int16_t *ihi = (int16_t*)&vEndIHi;
        int16_t *jhi = (int16_t*)&vEndJHi;
        int32_t k;
        for (k=0; k<N/2; ++k, ++t, ++ilo, ++jlo) {
            if (*t > score) {
                score = *t;
                end_query = *ilo;
                end_ref = *jlo;
            }
            else if (*t == score) {
                if (*jlo < end_ref) {
                    end_query = *ilo;
                    end_ref = *jlo;
                }
                else if (*jlo == end_ref && *ilo < end_query) {
                    end_query = *ilo;
                    end_ref = *jlo;
                }
            }
        }
        for (k=N/2; k<N; ++k, ++t, ++ihi, ++jhi) {
            if (*t > score) {
                score = *t;
                end_query = *ihi;
                end_ref = *jhi;
            }
            else if (*t == score) {
                if (*jhi < end_ref) {
                    end_query = *ihi;
                    end_ref = *jhi;
                }
                else if (*jhi == end_ref && *ihi < end_query) {
                    end_query = *ihi;
                    end_ref = *jhi;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}